

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::BeginMainMenuBar(void)

{
  ImVec2 IVar1;
  bool bVar2;
  bool bVar3;
  float _y;
  bool is_open;
  ImGuiWindowFlags window_flags;
  ImGuiContext *g;
  ImGuiWindowFlags in_stack_00000324;
  bool *in_stack_00000328;
  char *in_stack_00000330;
  float _x;
  undefined4 in_stack_ffffffffffffffb4;
  float local_48;
  float in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  uint uVar4;
  undefined4 in_stack_ffffffffffffffc4;
  int count;
  ImVec2 local_38;
  float in_stack_ffffffffffffffd0;
  float in_stack_ffffffffffffffd4;
  ImVec2 in_stack_ffffffffffffffd8;
  float in_stack_ffffffffffffffe4;
  ImVec2 local_18;
  ImGuiContext *local_10;
  
  local_10 = GImGui;
  _x = (GImGui->Style).DisplaySafeAreaPadding.x;
  _y = ImMax<float>((GImGui->Style).DisplaySafeAreaPadding.y - (GImGui->Style).FramePadding.y,0.0);
  ImVec2::ImVec2(&local_18,_x,_y);
  (local_10->NextWindowData).MenuBarOffsetMinVal = local_18;
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffe0,0.0,0.0);
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffd8,0.0,0.0);
  SetNextWindowPos((ImVec2 *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   (ImGuiCond)in_stack_ffffffffffffffbc,
                   (ImVec2 *)CONCAT44(in_stack_ffffffffffffffb4,_x));
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffd0,(local_10->IO).DisplaySize.x,
                 (local_10->NextWindowData).MenuBarOffsetMinVal.y + local_10->FontBaseSize +
                 (local_10->Style).FramePadding.y);
  SetNextWindowSize((ImVec2 *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                    (ImGuiCond)in_stack_ffffffffffffffbc);
  PushStyleVar((ImGuiStyleVar)in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
  ImVec2::ImVec2(&local_38,0.0,0.0);
  PushStyleVar((ImGuiStyleVar)in_stack_ffffffffffffffe4,(ImVec2 *)in_stack_ffffffffffffffd8);
  count = 0x50f;
  bVar2 = Begin(in_stack_00000330,in_stack_00000328,in_stack_00000324);
  bVar3 = false;
  if (bVar2) {
    bVar3 = BeginMenuBar();
  }
  uVar4 = (uint)bVar3 << 0x18;
  PopStyleVar(count);
  ImVec2::ImVec2((ImVec2 *)&local_48,0.0,0.0);
  IVar1.y = in_stack_ffffffffffffffbc;
  IVar1.x = local_48;
  (local_10->NextWindowData).MenuBarOffsetMinVal = IVar1;
  bVar2 = (uVar4 & 0x1000000) != 0;
  if (!bVar2) {
    End();
  }
  return bVar2;
}

Assistant:

bool ImGui::BeginMainMenuBar()
{
    ImGuiContext& g = *GImGui;
    g.NextWindowData.MenuBarOffsetMinVal = ImVec2(g.Style.DisplaySafeAreaPadding.x, ImMax(g.Style.DisplaySafeAreaPadding.y - g.Style.FramePadding.y, 0.0f));
    SetNextWindowPos(ImVec2(0.0f, 0.0f));
    SetNextWindowSize(ImVec2(g.IO.DisplaySize.x, g.NextWindowData.MenuBarOffsetMinVal.y + g.FontBaseSize + g.Style.FramePadding.y));
    PushStyleVar(ImGuiStyleVar_WindowRounding, 0.0f);
    PushStyleVar(ImGuiStyleVar_WindowMinSize, ImVec2(0, 0));
    ImGuiWindowFlags window_flags = ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoMove | ImGuiWindowFlags_NoScrollbar | ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_MenuBar;
    bool is_open = Begin("##MainMenuBar", NULL, window_flags) && BeginMenuBar();
    PopStyleVar(2);
    g.NextWindowData.MenuBarOffsetMinVal = ImVec2(0.0f, 0.0f);
    if (!is_open)
    {
        End();
        return false;
    }
    return true; //-V1020
}